

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_rectangle_gradient(rf_rec rec,rf_color col1,rf_color col2,rf_color col3,rf_color col4)

{
  uint local_40;
  uchar local_28;
  uchar uStack_27;
  uchar uStack_26;
  uchar uStack_25;
  uchar local_24;
  uchar uStack_23;
  uchar uStack_22;
  uchar uStack_21;
  rf_color col4_local;
  rf_color col3_local;
  rf_color col2_local;
  rf_color col1_local;
  rf_rec rec_local;
  
  rf_get_shapes_texture();
  rf_gfx_enable_texture(local_40);
  rf_gfx_push_matrix();
  rf_gfx_begin(RF_QUADS);
  rf_gfx_normal3f(0.0,0.0,1.0);
  col3_local.r = col1.r;
  col3_local.g = col1.g;
  col3_local.b = col1.b;
  col3_local.a = col1.a;
  rf_gfx_color4ub(col3_local.r,col3_local.g,col3_local.b,col3_local.a);
  rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                     (float)(rf__ctx->field_0).tex_shapes.width,
                     (rf__ctx->field_0).rec_tex_shapes.y /
                     (float)(rf__ctx->field_0).tex_shapes.height);
  col2_local = (rf_color)rec.x;
  col1_local = (rf_color)rec.y;
  rf_gfx_vertex2f((float)col2_local,(float)col1_local);
  col4_local.r = col2.r;
  col4_local.g = col2.g;
  col4_local.b = col2.b;
  col4_local.a = col2.a;
  rf_gfx_color4ub(col4_local.r,col4_local.g,col4_local.b,col4_local.a);
  rf_gfx_tex_coord2f((rf__ctx->field_0).rec_tex_shapes.x /
                     (float)(rf__ctx->field_0).tex_shapes.width,
                     ((rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
                     ) / (float)(rf__ctx->field_0).tex_shapes.height);
  rec_local.y = rec.height;
  rf_gfx_vertex2f((float)col2_local,(float)col1_local + rec_local.y);
  local_24 = col3.r;
  uStack_23 = col3.g;
  uStack_22 = col3.b;
  uStack_21 = col3.a;
  rf_gfx_color4ub(local_24,uStack_23,uStack_22,uStack_21);
  rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width)
                     / (float)(rf__ctx->field_0).tex_shapes.width,
                     ((rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
                     ) / (float)(rf__ctx->field_0).tex_shapes.height);
  rec_local.x = rec.width;
  rf_gfx_vertex2f((float)col2_local + rec_local.x,(float)col1_local + rec_local.y);
  local_28 = col4.r;
  uStack_27 = col4.g;
  uStack_26 = col4.b;
  uStack_25 = col4.a;
  rf_gfx_color4ub(local_28,uStack_27,uStack_26,uStack_25);
  rf_gfx_tex_coord2f(((rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width)
                     / (float)(rf__ctx->field_0).tex_shapes.width,
                     (rf__ctx->field_0).rec_tex_shapes.y /
                     (float)(rf__ctx->field_0).tex_shapes.height);
  rf_gfx_vertex2f((float)col2_local + rec_local.x,(float)col1_local);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_rectangle_gradient(rf_rec rec, rf_color col1, rf_color col2, rf_color col3, rf_color col4)
{
    rf_gfx_enable_texture(rf_get_shapes_texture().id);

    rf_gfx_push_matrix();
    rf_gfx_begin(RF_QUADS);
    rf_gfx_normal3f(0.0f, 0.0f, 1.0f);

    // NOTE: Default raylib font character 95 is a white square
    rf_gfx_color4ub(col1.r, col1.g, col1.b, col1.a);
    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x, rec.y);

    rf_gfx_color4ub(col2.r, col2.g, col2.b, col2.a);
    rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x, rec.y + rec.height);

    rf_gfx_color4ub(col3.r, col3.g, col3.b, col3.a);
    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x + rec.width, rec.y + rec.height);

    rf_gfx_color4ub(col4.r, col4.g, col4.b, col4.a);
    rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
    rf_gfx_vertex2f(rec.x + rec.width, rec.y);
    rf_gfx_end();
    rf_gfx_pop_matrix();

    rf_gfx_disable_texture();
}